

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landbasedwheeled.cpp
# Opt level: O3

void __thiscall fp::LandBasedWheeled::PickUp(LandBasedWheeled *this,string *string)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"LandBasedWheeled::Pickup the payload is called\n",0x2f);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(string->_M_dataplus)._M_p,string->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void fp::LandBasedWheeled::PickUp(std::string string) {
    std::cerr << "LandBasedWheeled::Pickup the payload is called\n" << string << std::endl;
}